

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

void Bac_NtkPrepareLibrary(Bac_Man_t *p,Mio_Library_t *pLib)

{
  Abc_Nam_t *pAVar1;
  int iVar2;
  Mio_Gate_t *pGate;
  Mio_Gate_t *pGate_00;
  Mio_Gate_t *pGate_01;
  char *pcVar3;
  Mio_Gate_t *pGate_02;
  
  pGate = Mio_LibraryReadConst0(pLib);
  pGate_00 = Mio_LibraryReadConst1(pLib);
  pGate_01 = Mio_LibraryReadBuf(pLib);
  if ((pGate_00 == (Mio_Gate_t *)0x0 || pGate == (Mio_Gate_t *)0x0) || pGate_01 == (Mio_Gate_t *)0x0
     ) {
    puts("The library does not have one of the elementary gates.");
    return;
  }
  pAVar1 = p->pMods;
  pcVar3 = Mio_GateReadName(pGate);
  iVar2 = Abc_NamStrFindOrAdd(pAVar1,pcVar3,(int *)0x0);
  p->ElemGates[0] = iVar2;
  pAVar1 = p->pMods;
  pcVar3 = Mio_GateReadName(pGate_00);
  iVar2 = Abc_NamStrFindOrAdd(pAVar1,pcVar3,(int *)0x0);
  p->ElemGates[1] = iVar2;
  pAVar1 = p->pMods;
  pcVar3 = Mio_GateReadName(pGate_01);
  iVar2 = Abc_NamStrFindOrAdd(pAVar1,pcVar3,(int *)0x0);
  p->ElemGates[2] = iVar2;
  for (pGate_02 = Mio_LibraryReadGates(pLib); pGate_02 != (Mio_Gate_t *)0x0;
      pGate_02 = Mio_GateReadNext(pGate_02)) {
    if (pGate_02 != pGate_01 && (pGate_02 != pGate_00 && pGate_02 != pGate)) {
      pAVar1 = p->pMods;
      pcVar3 = Mio_GateReadName(pGate_02);
      Abc_NamStrFindOrAdd(pAVar1,pcVar3,(int *)0x0);
    }
  }
  iVar2 = Abc_NamObjNumMax(p->pMods);
  if (1 < iVar2) {
    return;
  }
  __assert_fail("Abc_NamObjNumMax(p->pMods) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                ,0x1fb,"void Bac_NtkPrepareLibrary(Bac_Man_t *, Mio_Library_t *)");
}

Assistant:

void Bac_NtkPrepareLibrary( Bac_Man_t * p, Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    Mio_Gate_t * pGate0 = Mio_LibraryReadConst0( pLib );
    Mio_Gate_t * pGate1 = Mio_LibraryReadConst1( pLib );
    Mio_Gate_t * pGate2 = Mio_LibraryReadBuf( pLib );
    if ( !pGate0 || !pGate1 || !pGate2 )
    {
        printf( "The library does not have one of the elementary gates.\n" );
        return;
    }
    p->ElemGates[0] = Abc_NamStrFindOrAdd( p->pMods, Mio_GateReadName(pGate0), NULL );
    p->ElemGates[1] = Abc_NamStrFindOrAdd( p->pMods, Mio_GateReadName(pGate1), NULL );
    p->ElemGates[2] = Abc_NamStrFindOrAdd( p->pMods, Mio_GateReadName(pGate2), NULL );
    Mio_LibraryForEachGate( pLib, pGate )
        if ( pGate != pGate0 && pGate != pGate1 && pGate != pGate2 )
            Abc_NamStrFindOrAdd( p->pMods, Mio_GateReadName(pGate), NULL );
    assert( Abc_NamObjNumMax(p->pMods) > 1 );
}